

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession.c
# Opt level: O2

int mg_session_ensure_space_for_chunk(mg_session *session,size_t chunk_size)

{
  char *pcVar1;
  size_t sVar2;
  
  sVar2 = session->in_capacity;
  while( true ) {
    if (chunk_size <= sVar2 - session->in_end) {
      return 0;
    }
    pcVar1 = (char *)mg_allocator_realloc(session->allocator,session->in_buffer,sVar2 * 2);
    if (pcVar1 == (char *)0x0) break;
    sVar2 = session->in_capacity * 2;
    session->in_capacity = sVar2;
    session->in_buffer = pcVar1;
  }
  mg_session_set_error(session,"failed to enlarge incoming message buffer");
  return -3;
}

Assistant:

int mg_session_ensure_space_for_chunk(mg_session *session, size_t chunk_size) {
  while (session->in_capacity - session->in_end < chunk_size) {
    char *new_in_buffer = mg_allocator_realloc(
        session->allocator, session->in_buffer, 2 * session->in_capacity);
    if (!new_in_buffer) {
      mg_session_set_error(session,
                           "failed to enlarge incoming message buffer");
      return MG_ERROR_OOM;
    }
    session->in_capacity = 2 * session->in_capacity;
    session->in_buffer = new_in_buffer;
  }
  return 0;
}